

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

iterator * __thiscall
ft::map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::insert
          (iterator *__return_storage_ptr__,
          map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          iterator *position,value_type *val)

{
  size_type *psVar1;
  int iVar2;
  treeNode<ft::pair<const_int,_int>_> *ptVar3;
  treeNode<ft::pair<const_int,_int>_> *val_00;
  treeNode<ft::pair<const_int,_int>_> *ptVar4;
  treeNode<ft::pair<const_int,_int>_> *ptVar5;
  treeNode<ft::pair<const_int,_int>_> *ptVar6;
  treeNode<ft::pair<const_int,_int>_> *ptVar7;
  bool bVar8;
  treeNode<ft::pair<const_int,_int>_> *local_38;
  char local_30;
  
  ptVar5 = (this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>)
           .
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           .m_tree.m_last;
  val_00 = position->m_node;
  if (val_00 == ptVar5) {
    if ((this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
        super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
        .m_size != 0) {
      ptVar5 = position->m_tree->NIL;
      ptVar3 = val_00->left;
      ptVar4 = val_00;
      if (val_00->left == ptVar5) {
        do {
          val_00 = ptVar4->parent;
          bVar8 = val_00->left == ptVar4;
          ptVar4 = val_00;
        } while (bVar8);
      }
      else {
        do {
          val_00 = ptVar3;
          ptVar3 = val_00->right;
        } while (val_00->right != ptVar5);
      }
      position->m_node = val_00;
      if ((val_00->value).first < val->first) goto LAB_0010778f;
    }
LAB_00107781:
    val_00 = (this->
             super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
             super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
             .m_tree.m_root;
  }
  else {
    if (val->first == (val_00->value).first) {
      __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113c70;
      __return_storage_ptr__->m_tree = position->m_tree;
      local_38 = val_00;
      goto LAB_001077c2;
    }
    if ((this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
        super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
        .m_size == 0) goto LAB_00107781;
    iVar2 = val->first;
    ptVar3 = position->m_tree->NIL;
    if ((val_00->value).first < iVar2) {
      ptVar4 = val_00;
      ptVar6 = val_00->right;
      if (val_00->right == ptVar3) {
        do {
          ptVar7 = ptVar4->parent;
          bVar8 = ptVar7->right == ptVar4;
          ptVar4 = ptVar7;
        } while (bVar8);
      }
      else {
        do {
          ptVar7 = ptVar6;
          ptVar6 = ptVar7->left;
        } while (ptVar7->left != ptVar3);
      }
      if ((ptVar7 != ptVar5) && ((ptVar7->value).first <= iVar2)) goto LAB_00107781;
    }
    else {
      ptVar5 = val_00;
      ptVar4 = val_00->left;
      if (val_00->left == ptVar3) {
        do {
          ptVar6 = ptVar5->parent;
          bVar8 = ptVar6->left == ptVar5;
          ptVar5 = ptVar6;
        } while (bVar8);
      }
      else {
        do {
          ptVar6 = ptVar4;
          ptVar4 = ptVar6->right;
        } while (ptVar6->right != ptVar3);
      }
      if ((val_00 != ((this->
                      super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                      ).
                      super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                      .m_tree.m_first)->parent) && (iVar2 <= (ptVar6->value).first))
      goto LAB_00107781;
    }
  }
LAB_0010778f:
  BSTinsert((map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)
            &stack0xffffffffffffffc8,(node *)this,&val_00->value);
  if (local_30 != '\0') {
    treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
    ::fixInsertViolation
              ((treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
                *)this,local_38);
    psVar1 = &(this->
              super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
              super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
              .m_size;
    *psVar1 = *psVar1 + 1;
  }
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113c70;
  __return_storage_ptr__->m_tree =
       &(this->super_mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>).
        super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
        .m_tree;
LAB_001077c2:
  __return_storage_ptr__->m_node = local_38;
  return __return_storage_ptr__;
}

Assistant:

iterator	insert(iterator position, value_type const & val)
	{
		if (position != this->end() && this->equal(position->first, val.first)) return position;

		ft::pair<node*, bool>	ret;

		if (this->empty())
			ret = this->BSTinsert(this->root(), val);
		else if (position == this->end())
		{
			--position;
			if (this->value_comp()(*position, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else if (this->value_comp()(*position, val))
		{
			iterator	tmp(position);
			++tmp;
			if (tmp == this->end() || this->value_comp()(val, *tmp))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else
		{
			iterator	tmp(position);
			--tmp;
			if (position == this->begin() || this->value_comp()(*tmp, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		if (ret.second)
		{
			this->fixInsertViolation(ret.first);
			++this->m_size;
		}
		return iterator(this->m_tree, ret.first);
	}